

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

bool __thiscall QDateTime::isDaylightTime(QDateTime *this)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  DaylightStatus DVar4;
  int iVar5;
  QDateTimePrivate *pQVar6;
  QTimeZonePrivate *pQVar7;
  qint64 qVar8;
  Data *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_stack_0000001c;
  DaylightStatus dst_1;
  DaylightStatus dst;
  undefined4 in_stack_ffffffffffffff88;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffff8c;
  TransitionResolution in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  DaylightStatus local_3c;
  bool local_21;
  qint64 in_stack_ffffffffffffffe0;
  DaylightStatus local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValid((QDateTime *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar2) {
    TVar3 = getSpec((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (TVar3 == LocalTime) {
      getStatus((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_3c = extractDaylightStatus((StatusFlags)in_stack_ffffffffffffff8c.i);
      if (local_3c == UnknownDaylightTime) {
        getMSecs((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff8c.i,in_stack_ffffffffffffff88));
        toTransitionOptions(in_stack_ffffffffffffff90);
        QDateTimePrivate::localStateAtMillis
                  (in_stack_ffffffffffffffe0,(TransitionOptions)in_stack_0000001c.i);
        local_3c = local_14;
      }
      local_21 = local_3c == DaylightTime;
    }
    else if (TVar3 - UTC < 2) {
      local_21 = false;
    }
    else if (TVar3 == TimeZone) {
      getStatus((QDateTimeData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      DVar4 = extractDaylightStatus((StatusFlags)in_stack_ffffffffffffff8c.i);
      if (DVar4 == UnknownDaylightTime) {
        pQVar6 = Data::operator->(in_RDI);
        pQVar7 = QTimeZone::Data::operator->((Data *)&pQVar6->m_timeZone);
        qVar8 = toMSecsSinceEpoch((QDateTime *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        iVar5 = (*pQVar7->_vptr_QTimeZonePrivate[0xc])(pQVar7,qVar8);
        local_21 = (bool)((byte)iVar5 & 1);
      }
      else {
        local_21 = DVar4 == DaylightTime;
      }
    }
    else {
      local_21 = false;
    }
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTime::isDaylightTime() const
{
    if (!isValid())
        return false;

    switch (getSpec(d)) {
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        return false;
    case Qt::TimeZone:
#if !QT_CONFIG(timezone)
        break;
#else
        Q_ASSERT(d->m_timeZone.isValid());
        if (auto dst = extractDaylightStatus(getStatus(d));
            dst != QDateTimePrivate::UnknownDaylightTime) {
            return dst == QDateTimePrivate::DaylightTime;
        }
        return d->m_timeZone.d->isDaylightTime(toMSecsSinceEpoch());
#endif // timezone
    case Qt::LocalTime: {
        auto dst = extractDaylightStatus(getStatus(d));
        if (dst == QDateTimePrivate::UnknownDaylightTime) {
            dst = QDateTimePrivate::localStateAtMillis(
                getMSecs(d), toTransitionOptions(TransitionResolution::LegacyBehavior)).dst;
        }
        return dst == QDateTimePrivate::DaylightTime;
        }
    }
    return false;
}